

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

void test_want(Constraint *constraint,char *function,CgreenValue actual,char *test_file,
              int test_line,TestReporter *reporter)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  char *pcVar3;
  char parameter_name_actual_string [255];
  
  _Var2 = parameters_are_not_valid_for(constraint,actual.value.integer_value);
  if (_Var2) {
    pcVar3 = validation_failure_message_for(constraint,actual.value.integer_value);
    (*reporter->assert_true)(reporter,test_file,test_line,0,pcVar3);
    free(pcVar3);
    return;
  }
  __snprintf_chk(parameter_name_actual_string,0xfe,1,0xff,"[%s] parameter in [%s]",
                 constraint->parameter_name,function);
  pcVar3 = (*constraint->failure_message)
                     (constraint,parameter_name_actual_string,actual.value.integer_value);
  p_Var1 = reporter->assert_true;
  _Var2 = (*constraint->compare)(constraint,actual);
  (*p_Var1)(reporter,test_file,test_line,(uint)_Var2,pcVar3);
  free(pcVar3);
  return;
}

Assistant:

void test_want(Constraint *constraint, const char *function, CgreenValue actual,
               const char *test_file, int test_line, TestReporter *reporter) {
    char *message;
    char parameter_name_actual_string[255];

    if (parameters_are_not_valid_for(constraint, actual.value.integer_value)) {
        message = validation_failure_message_for(constraint, actual.value.integer_value);

        (*reporter->assert_true)(
                reporter,
                test_file,
                test_line,
                false,
                message);

        free(message);

        return;
    }

    snprintf(parameter_name_actual_string, sizeof(parameter_name_actual_string) - 1, "[%s] parameter in [%s]", constraint->parameter_name, function);
    message = constraint->failure_message(constraint, parameter_name_actual_string, actual.value.integer_value);

    (*reporter->assert_true)(
            reporter,
            test_file,
            test_line,
            (*constraint->compare)(constraint, actual),
            message);

    free(message);
}